

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseOptionNamePart
          (Parser *this,UninterpretedOption *uninterpreted_option,LocationRecorder *part_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *psVar2;
  undefined1 local_98 [8];
  LocationRecorder location_1;
  LocationRecorder location;
  undefined1 local_58 [8];
  string identifier;
  NamePart *name;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *part_location_local;
  UninterpretedOption *uninterpreted_option_local;
  Parser *this_local;
  
  identifier.field_2._8_8_ = UninterpretedOption::add_name(uninterpreted_option);
  std::__cxx11::string::string((string *)local_58);
  bVar1 = LookingAt(this,"(");
  if (bVar1) {
    bVar1 = Consume(this,"(");
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_006387b5;
    }
    LocationRecorder::LocationRecorder((LocationRecorder *)&location_1.location_,part_location,1);
    bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
    if (bVar1) {
      bVar1 = ConsumeIdentifier(this,(string *)local_58,"Expected identifier.");
      if (bVar1) {
        psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_
                           ((UninterpretedOption_NamePart *)identifier.field_2._8_8_);
        std::__cxx11::string::append((string *)psVar2);
        goto LAB_00638598;
      }
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
LAB_00638598:
      while (bVar1 = LookingAt(this,"."), bVar1) {
        bVar1 = Consume(this,".");
        if (!bVar1) {
          this_local._7_1_ = 0;
          bVar1 = true;
          goto LAB_0063868c;
        }
        psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_
                           ((UninterpretedOption_NamePart *)identifier.field_2._8_8_);
        std::__cxx11::string::append((char *)psVar2);
        bVar1 = ConsumeIdentifier(this,(string *)local_58,"Expected identifier.");
        if (!bVar1) {
          this_local._7_1_ = 0;
          bVar1 = true;
          goto LAB_0063868c;
        }
        psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_
                           ((UninterpretedOption_NamePart *)identifier.field_2._8_8_);
        std::__cxx11::string::append((string *)psVar2);
      }
      bVar1 = false;
    }
LAB_0063868c:
    LocationRecorder::~LocationRecorder((LocationRecorder *)&location_1.location_);
    if (bVar1) goto LAB_006387b5;
    bVar1 = Consume(this,")");
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_006387b5;
    }
    UninterpretedOption_NamePart::set_is_extension
              ((UninterpretedOption_NamePart *)identifier.field_2._8_8_,true);
  }
  else {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_98,part_location,1);
    bVar1 = ConsumeIdentifier(this,(string *)local_58,"Expected identifier.");
    if (bVar1) {
      psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_
                         ((UninterpretedOption_NamePart *)identifier.field_2._8_8_);
      std::__cxx11::string::append((string *)psVar2);
      UninterpretedOption_NamePart::set_is_extension
                ((UninterpretedOption_NamePart *)identifier.field_2._8_8_,false);
    }
    else {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_98);
    if (!bVar1) goto LAB_006387b5;
  }
  this_local._7_1_ = 1;
LAB_006387b5:
  std::__cxx11::string::~string((string *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseOptionNamePart(UninterpretedOption* uninterpreted_option,
                                 const LocationRecorder& part_location,
                                 const FileDescriptorProto* containing_file) {
  UninterpretedOption::NamePart* name = uninterpreted_option->add_name();
  std::string identifier;  // We parse identifiers into this string.
  if (LookingAt("(")) {    // This is an extension.
    DO(Consume("("));

    {
      LocationRecorder location(
          part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
      // An extension name consists of dot-separated identifiers, and may begin
      // with a dot.
      if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
      while (LookingAt(".")) {
        DO(Consume("."));
        name->mutable_name_part()->append(".");
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
    }

    DO(Consume(")"));
    name->set_is_extension(true);
  } else {  // This is a regular field.
    LocationRecorder location(
        part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    name->mutable_name_part()->append(identifier);
    name->set_is_extension(false);
  }
  return true;
}